

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  string_view module_name;
  Result RVar2;
  RegisterCommand *this_00;
  Enum EVar3;
  Location local_118;
  Var local_f0;
  undefined1 local_a8 [8];
  Location loc;
  Var var;
  string text;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ != Error) {
    GetLocation((Location *)local_a8,this);
    RVar2 = Expect(this,Register);
    if (RVar2.enum_ != Error) {
      var.field_2._24_8_ = &text._M_string_length;
      text._M_dataplus._M_p = (pointer)0x0;
      text._M_string_length._0_1_ = 0;
      local_118.field_1.field_0.line = 0;
      local_118.field_1._4_8_ = 0;
      local_118.filename.data_ = (char *)0x0;
      local_118.filename.size_._0_4_ = 0;
      local_118.filename.size_._4_4_ = 0;
      Var::Var((Var *)((long)&loc.field_1 + 8),0xffffffff,&local_118);
      RVar2 = ParseQuotedText(this,(string *)((long)&var.field_2 + 0x18));
      EVar3 = Error;
      if (RVar2.enum_ != Error) {
        Var::Var(&local_f0,this->last_module_index_,(Location *)local_a8);
        ParseVarOpt(this,(Var *)((long)&loc.field_1 + 8),&local_f0);
        Var::~Var(&local_f0);
        RVar2 = Expect(this,Rpar);
        if (RVar2.enum_ != Error) {
          this_00 = (RegisterCommand *)operator_new(0x78);
          module_name.size_ = (size_type)text._M_dataplus._M_p;
          module_name.data_ = (char *)var.field_2._24_8_;
          RegisterCommand::RegisterCommand(this_00,module_name,(Var *)((long)&loc.field_1 + 8));
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)this_00;
          EVar3 = Ok;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
            EVar3 = Ok;
          }
        }
      }
      Var::~Var((Var *)((long)&loc.field_1 + 8));
      std::__cxx11::string::~string((string *)((long)&var.field_2 + 0x18));
      return (Result)EVar3;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}